

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

void calcBias<Blob<384>,unsigned_int>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  code *in_RDI;
  byte in_R8B;
  int bitB;
  int bitA;
  int iOut;
  int iBit;
  int *cursor;
  int irep;
  uint B;
  uint A;
  Blob<384> K;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  uint32_t local_80;
  uint32_t in_stack_ffffffffffffff84;
  int *in_stack_ffffffffffffff88;
  int iVar3;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 local_68 [4];
  Blob<384> local_64;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  byte local_21;
  int local_14;
  vector<int,_std::allocator<int>_> *local_10;
  code *local_8;
  
  local_21 = in_R8B & 1;
  local_28 = 0x30;
  local_2c = 4;
  local_30 = 0x180;
  local_34 = 0x20;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Blob<384>::Blob(&local_64);
  for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
    if (((local_21 & 1) != 0) && (iVar3 % (local_14 / 10) == 0)) {
      printf(".");
    }
    Rand::rand_p((Rand *)CONCAT44(in_stack_ffffffffffffff94,iVar3),in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff84);
    (*local_8)(&local_64,0x30,0,local_68);
    in_stack_ffffffffffffff88 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    for (in_stack_ffffffffffffff84 = 0; (int)in_stack_ffffffffffffff84 < 0x180;
        in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
      flipbit(&local_64,0x30,in_stack_ffffffffffffff84);
      (*local_8)(&local_64,0x30,0,&stack0xffffffffffffff94);
      flipbit(&local_64,0x30,in_stack_ffffffffffffff84);
      for (local_80 = 0; (int)local_80 < 0x20; local_80 = local_80 + 1) {
        uVar1 = getbit(local_68,4,local_80);
        uVar2 = getbit(&stack0xffffffffffffff94,4,local_80);
        *in_stack_ffffffffffffff88 = (uVar1 ^ uVar2) + *in_stack_ffffffffffffff88;
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}